

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_check.c
# Opt level: O0

_Bool ch_checkstring(ch_context *vm,ch_primitive value,ch_string **actual)

{
  _Bool _Var1;
  ch_primitive value_00;
  ch_object *local_38;
  ch_object *object_value;
  ch_string **actual_local;
  ch_context *vm_local;
  ch_primitive value_local;
  
  value_00.field_1 = value.field_1;
  value_00.type = value.type;
  local_38 = (ch_object *)0x0;
  value_00._4_4_ = 0;
  object_value = (ch_object *)actual;
  actual_local = (ch_string **)vm;
  vm_local._0_4_ = value_00.type;
  value_local._0_8_ = value_00.field_1;
  _Var1 = checkobject(vm,value_00,&local_38);
  if (_Var1) {
    if (local_38->type == TYPE_STRING) {
      *(ch_object **)object_value = local_38;
      value_local.field_1._7_1_ = 1;
    }
    else {
      ch_runtime_error((ch_context *)actual_local,EXIT_USER_ERROR,
                       "Expected string type, but got object type %d instead",(ulong)local_38->type)
      ;
      value_local.field_1._7_1_ = 0;
    }
  }
  else {
    value_local.field_1._7_1_ = 0;
  }
  return value_local.field_1._7_1_;
}

Assistant:

bool ch_checkstring(ch_context* vm, ch_primitive value, ch_string** actual) {
	ch_object* object_value = NULL;
	if(!checkobject(vm, value, &object_value)) return false;

	if (!IS_STRING(object_value)) {
		ch_runtime_error(vm, EXIT_USER_ERROR, "Expected string type, but got object type %d instead", object_value->type);
		return false;
	}

	*actual = AS_STRING(object_value);

	return true;
}